

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICharReader.h
# Opt level: O0

void __thiscall ICharReader::ICharReader(ICharReader *this,ifstream *ifs,ostream *os,int deep)

{
  int deep_local;
  ostream *os_local;
  ifstream *ifs_local;
  ICharReader *this_local;
  
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00122b58;
  std::__cxx11::string::operator=((string *)&(this->super_IAbstractReader).m_dataType,"Char");
  return;
}

Assistant:

explicit ICharReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep) {
        m_dataType = "Char";
    }